

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

GLFWcursor * glfwCreateCursor(GLFWimage *image,int xhot,int yhot)

{
  int iVar1;
  _GLFWcursor *cursor;
  char *format;
  
  if (image == (GLFWimage *)0x0) {
    __assert_fail("image != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/build_O1/_deps/glfw-src/src/input.c"
                  ,0x2ee,"GLFWcursor *glfwCreateCursor(const GLFWimage *, int, int)");
  }
  if (image->pixels != (uchar *)0x0) {
    if (_glfw.initialized == 0) {
      iVar1 = 0x10001;
      format = (char *)0x0;
    }
    else {
      if ((0 < image->width) && (0 < image->height)) {
        cursor = (_GLFWcursor *)calloc(1,0x10);
        cursor->next = _glfw.cursorListHead;
        _glfw.cursorListHead = cursor;
        iVar1 = _glfwPlatformCreateCursor(cursor,image,xhot,yhot);
        if (iVar1 != 0) {
          return (GLFWcursor *)cursor;
        }
        glfwDestroyCursor((GLFWcursor *)cursor);
        return (GLFWcursor *)0x0;
      }
      format = "Invalid image dimensions for cursor";
      iVar1 = 0x10004;
    }
    _glfwInputError(iVar1,format);
    return (GLFWcursor *)0x0;
  }
  __assert_fail("image->pixels != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/build_O1/_deps/glfw-src/src/input.c"
                ,0x2ef,"GLFWcursor *glfwCreateCursor(const GLFWimage *, int, int)");
}

Assistant:

GLFWAPI GLFWcursor* glfwCreateCursor(const GLFWimage* image, int xhot, int yhot)
{
    _GLFWcursor* cursor;

    assert(image != NULL);
    assert(image->pixels != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (image->width <= 0 || image->height <= 0)
    {
        _glfwInputError(GLFW_INVALID_VALUE, "Invalid image dimensions for cursor");
        return NULL;
    }

    cursor = calloc(1, sizeof(_GLFWcursor));
    cursor->next = _glfw.cursorListHead;
    _glfw.cursorListHead = cursor;

    if (!_glfwPlatformCreateCursor(cursor, image, xhot, yhot))
    {
        glfwDestroyCursor((GLFWcursor*) cursor);
        return NULL;
    }

    return (GLFWcursor*) cursor;
}